

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Meteomatics_Internals.h
# Opt level: O2

size_t __thiscall
MMIntern::HttpClient::requestString
          (HttpClient *this,string *url,string *path,string *readBuffer,int timeout,int *http_code)

{
  int iVar1;
  ostream *poVar2;
  long lVar3;
  undefined8 uVar4;
  char *pcVar5;
  size_t sVar6;
  string query;
  long l_http_code;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  *http_code = 0;
  std::__cxx11::string::string((string *)&query,(string *)url);
  std::__cxx11::string::append((string *)&query);
  readBuffer->_M_string_length = 0;
  *(readBuffer->_M_dataplus)._M_p = '\0';
  poVar2 = std::operator<<((ostream *)&std::cout,"requesting string from ");
  poVar2 = std::operator<<(poVar2,(string *)&query);
  std::endl<char,std::char_traits<char>>(poVar2);
  lVar3 = curl_easy_init();
  if (lVar3 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"curl_easy_init failed, cannot query server ");
    poVar2 = std::operator<<(poVar2,(string *)url);
    poVar2 = std::operator<<(poVar2," with query ");
    poVar2 = std::operator<<(poVar2,(string *)&query);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    uVar4 = curl_slist_append(0,"Content-Type: text/plain");
    curl_easy_setopt(lVar3,0x2727,uVar4);
    curl_easy_setopt(lVar3,0x2712,query._M_dataplus._M_p);
    curl_easy_setopt(lVar3,0x4e2b,writeStringCallback);
    curl_easy_setopt(lVar3,0x2711,readBuffer);
    curl_easy_setopt(lVar3,99,1);
    curl_easy_setopt(lVar3,0xd,timeout);
    if (((this->user)._M_string_length != 0) && ((this->password)._M_string_length != 0)) {
      std::operator+(&local_50,&this->user,":");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &l_http_code,&local_50,&this->password);
      std::__cxx11::string::~string((string *)&local_50);
      curl_easy_setopt(lVar3,0x2715,l_http_code);
      std::__cxx11::string::~string((string *)&l_http_code);
    }
    iVar1 = curl_easy_perform(lVar3);
    if (iVar1 == 0) {
      l_http_code = 0;
      curl_easy_getinfo(lVar3,0x200002);
      curl_easy_cleanup(lVar3);
      *http_code = (int)l_http_code;
      if ((int)l_http_code - 200U < 300) {
        sVar6 = readBuffer->_M_string_length;
        goto LAB_00106a37;
      }
      readBuffer->_M_string_length = 0;
      *(readBuffer->_M_dataplus)._M_p = '\0';
      poVar2 = std::operator<<((ostream *)&std::cout,"Server ");
      poVar2 = std::operator<<(poVar2,(string *)url);
      poVar2 = std::operator<<(poVar2," with query ");
      poVar2 = std::operator<<(poVar2,(string *)&query);
      poVar2 = std::operator<<(poVar2," replied with code ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*http_code);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"curl_easy_perform() to server ");
      poVar2 = std::operator<<(poVar2,(string *)url);
      poVar2 = std::operator<<(poVar2," with query ");
      poVar2 = std::operator<<(poVar2,(string *)&query);
      poVar2 = std::operator<<(poVar2," failed: ");
      pcVar5 = (char *)curl_easy_strerror(iVar1);
      poVar2 = std::operator<<(poVar2,pcVar5);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  sVar6 = 0;
LAB_00106a37:
  std::__cxx11::string::~string((string *)&query);
  return sVar6;
}

Assistant:

std::size_t MMIntern::HttpClient::requestString(const std::string& url, const std::string& path, std::string& readBuffer, int timeout, int& http_code)
{
    http_code = 0;
    std::string query(url);
    query += path;
    
    readBuffer.clear();
    
    std::cout << "requesting string from " << query << std::endl;
    CURL* curl = curl_easy_init();
    if(curl)
    {
        struct curl_slist *headers=nullptr; // init to NULL is important
        headers = curl_slist_append(headers, "Content-Type: text/plain");
        
        curl_easy_setopt(curl, CURLOPT_HTTPHEADER, headers );
        curl_easy_setopt(curl, CURLOPT_URL, query.c_str());
        curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, writeStringCallback);
        curl_easy_setopt(curl, CURLOPT_WRITEDATA, &readBuffer);
        curl_easy_setopt(curl, CURLOPT_NOSIGNAL, 1);
        curl_easy_setopt(curl, CURLOPT_TIMEOUT, timeout);
        if (!user.empty() && !password.empty())
        {
            const std::string auth=user+":"+password;
            curl_easy_setopt(curl, CURLOPT_USERPWD, auth.c_str());
        }
        
        CURLcode res = curl_easy_perform(curl);
        if(res != CURLE_OK)
        {
            std::cout << "curl_easy_perform() to server " << url << " with query " << query <<" failed: " << curl_easy_strerror(res) << std::endl;
            return 0;
        }
        long l_http_code = 0;
        curl_easy_getinfo (curl, CURLINFO_RESPONSE_CODE, &l_http_code);
        curl_easy_cleanup(curl);
        http_code = static_cast<int>(l_http_code);
        
        if (!http_server_available(http_code))
        {
            readBuffer.clear();
            std::cout << "Server " << url << " with query " << query <<" replied with code " << http_code << std::endl;
            return 0;
        }
        
        return readBuffer.length();
    }
    else
    {
        std::cout << "curl_easy_init failed, cannot query server " << url << " with query " << query << std::endl;
    }
    
    return 0;
}